

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

bool __thiscall MPLSParser::parse(MPLSParser *this,char *fileName)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint8_t *buffer;
  ssize_t sVar4;
  size_t __nbytes;
  int64_t fileSize;
  File file;
  uint local_60;
  undefined4 uStack_5c;
  File local_58;
  
  File::File(&local_58);
  __nbytes = 0;
  iVar3 = File::open(&local_58,fileName,1);
  if ((char)iVar3 != '\0') {
    bVar2 = File::size(&local_58,(int64_t *)&local_60);
    uVar1 = local_60;
    if (bVar2) {
      buffer = (uint8_t *)operator_new__(CONCAT44(uStack_5c,local_60));
      sVar4 = File::read(&local_58,(int)buffer,(void *)(ulong)uVar1,__nbytes);
      bVar2 = (int)sVar4 != 0;
      if (bVar2) {
        parse(this,buffer,local_60);
      }
      operator_delete__(buffer);
      goto LAB_001e30d0;
    }
  }
  bVar2 = false;
LAB_001e30d0:
  File::~File(&local_58);
  return bVar2;
}

Assistant:

bool MPLSParser::parse(const char* fileName)
{
    File file;
    if (!file.open(fileName, File::ofRead))
        return false;
    int64_t fileSize;
    if (!file.size(&fileSize))
        return false;
    const auto buffer = new uint8_t[fileSize];
    if (!file.read(buffer, static_cast<uint32_t>(fileSize)))
    {
        delete[] buffer;
        return false;
    }
    try
    {
        parse(buffer, static_cast<int>(fileSize));
        delete[] buffer;
        return true;
    }
    catch (...)
    {
        delete[] buffer;
        return false;
    }
}